

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O0

int make_socket_non_block(int sfd)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  int res;
  int flags;
  int sfd_local;
  
  uVar1 = fcntl(sfd,3);
  if (uVar1 == 0xffffffff) {
    pcVar3 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                     ,0x2f);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                       ,0x5c);
      if (pcVar3 == (char *)0x0) {
        local_28 = 
        "/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
        ;
      }
      else {
        local_28 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                           ,0x5c);
        local_28 = local_28 + 1;
      }
      local_20 = local_28;
    }
    else {
      local_20 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                         ,0x2f);
      local_20 = local_20 + 1;
    }
    printf("\x1b[31mERROR: %s: %s: %d: cannot get socket flags!\x1b[m\n",local_20,
           "make_socket_non_block",0x43);
    sk_on_global_error();
    flags = -1;
  }
  else {
    iVar2 = fcntl(sfd,4,(ulong)(uVar1 | 0x800));
    if (iVar2 == -1) {
      pcVar3 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                       ,0x2f);
      if (pcVar3 == (char *)0x0) {
        pcVar3 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                         ,0x5c);
        if (pcVar3 == (char *)0x0) {
          local_38 = 
          "/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
          ;
        }
        else {
          local_38 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                             ,0x5c);
          local_38 = local_38 + 1;
        }
        local_30 = local_38;
      }
      else {
        local_30 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                           ,0x2f);
        local_30 = local_30 + 1;
      }
      printf("\x1b[31mERROR: %s: %s: %d: cannot set socket flags!\x1b[m\n",local_30,
             "make_socket_non_block",0x4b);
      sk_on_global_error();
      flags = -1;
    }
    else {
      flags = 0;
    }
  }
  return flags;
}

Assistant:

static int make_socket_non_block(int sfd)
{
    int flags, res;

    flags = fcntl(sfd, F_GETFL);
    if (flags == -1) {
        LOGE("cannot get socket flags!");
        sk_on_global_error();
        return -1;
    }

    flags |= O_NONBLOCK;
    res = fcntl(sfd, F_SETFL, flags);
    if (res == -1) {
        LOGE("cannot set socket flags!");
        sk_on_global_error();
        return -1;
    }

    return 0;
}